

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int height;
  FILE *__stream;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  GLFWmonitor *pGVar4;
  GLFWvidmode *pGVar5;
  _func_void_GLFWwindow_ptr_int_int_int_int *cbfun;
  undefined8 uVar6;
  anon_class_24_3_238ca983 local_298;
  function<void_()> local_280;
  undefined1 local_260 [8];
  ManualTicker manualTicker;
  Renderer renderer;
  GLenum err;
  int deviceHeight;
  int deviceWidth;
  GLFWvidmode *vidMode;
  GLFWwindow *window;
  PictureRendererWithTransition pictureRendererWithTransition;
  undefined1 local_e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  picturePaths;
  runtime_error e;
  MesmerizeOptions local_a8;
  undefined1 local_60 [8];
  MesmerizeOptions options;
  char **argv_local;
  int argc_local;
  
  options.PathToPicturesFolder.field_2._8_8_ = argv;
  if (argc != 1) {
    MesmerizeOptions::MesmerizeOptions((MesmerizeOptions *)local_60);
    MesmerizeOptions::FromArgs(&local_a8,argc,(char **)options.PathToPicturesFolder.field_2._8_8_);
    MesmerizeOptions::operator=((MesmerizeOptions *)local_60,&local_a8);
    MesmerizeOptions::~MesmerizeOptions(&local_a8);
    GetShuffledPicturePaths::GetShuffledPicturePaths
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_e0,(string *)&options.PanPercentage);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_e0);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Folder ");
      poVar3 = std::operator<<(poVar3,(string *)&options.PanPercentage);
      std::operator<<(poVar3," has no pictures (.jpg or .png)\n");
      argv_local._4_4_ = 0;
      pictureRendererWithTransition._260_4_ = 1;
    }
    else {
      PictureRendererWithTransition::PictureRendererWithTransition
                ((PictureRendererWithTransition *)&window,options.OpacityAnimationDuration,
                 options.DisplayPictureDuration,options.ResolutionY,
                 (float)options.PanAnimationDuration,(float)options.ZoomAnimationDuration);
      iVar2 = glfwInit();
      if (iVar2 == 0) {
        argv_local._4_4_ = -1;
        pictureRendererWithTransition._260_4_ = 1;
      }
      else {
        pGVar4 = glfwGetPrimaryMonitor();
        pGVar5 = glfwGetVideoMode(pGVar4);
        iVar2 = pGVar5->width;
        height = pGVar5->height;
        if ((local_60[0] & 1U) == 0) {
          if ((local_60[1] & 1U) == 0) {
            vidMode = (GLFWvidmode *)
                      glfwCreateWindow(local_60._4_4_,options._0_4_,"Mesmerize",(GLFWmonitor *)0x0,
                                       (GLFWwindow *)0x0);
          }
          else {
            vidMode = (GLFWvidmode *)
                      glfwCreateWindow(iVar2,height,"Mesmerize",(GLFWmonitor *)0x0,(GLFWwindow *)0x0
                                      );
          }
        }
        else if ((local_60[1] & 1U) == 0) {
          pGVar4 = glfwGetPrimaryMonitor();
          vidMode = (GLFWvidmode *)
                    glfwCreateWindow(local_60._4_4_,options._0_4_,"Mesmerize",pGVar4,
                                     (GLFWwindow *)0x0);
        }
        else {
          pGVar4 = glfwGetPrimaryMonitor();
          vidMode = (GLFWvidmode *)
                    glfwCreateWindow(iVar2,height,"Mesmerize",pGVar4,(GLFWwindow *)0x0);
        }
        if (vidMode == (GLFWvidmode *)0x0) {
          glfwTerminate();
          argv_local._4_4_ = -1;
          pictureRendererWithTransition._260_4_ = 1;
        }
        else {
          glfwMakeContextCurrent((GLFWwindow *)vidMode);
          cbfun = main::$_1::operator_cast_to_function_pointer((__1 *)&renderer);
          glfwSetKeyCallback((GLFWwindow *)vidMode,cbfun);
          DeviceInformation::init((EVP_PKEY_CTX *)vidMode);
          iVar2 = glewInit();
          __stream = _stderr;
          if (iVar2 != 0) {
            uVar6 = glewGetErrorString(iVar2);
            fprintf(__stream,"Error: %s\n",uVar6);
          }
          ClearGlErrors();
          glEnable(0xbe2);
          bVar1 = GlLogCall("glEnable(GL_BLEND)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/main.cpp"
                            ,0x7a);
          if (!bVar1) {
            raise(5);
          }
          ClearGlErrors();
          glBlendFunc(0x302,0x303);
          bVar1 = GlLogCall("glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/main.cpp"
                            ,0x7b);
          if (!bVar1) {
            raise(5);
          }
          ClearGlErrors();
          (*___glewBlendEquation)(0x8006);
          bVar1 = GlLogCall("glBlendEquation(GL_FUNC_ADD)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/main.cpp"
                            ,0x7c);
          if (!bVar1) {
            raise(5);
          }
          Picture::InitShaders();
          glfwSwapInterval(1);
          local_298.picturePaths =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_e0;
          local_298.manualTicker = (ManualTicker *)local_260;
          local_298.pictureRendererWithTransition = (PictureRendererWithTransition *)&window;
          std::function<void()>::function<main::__0,void>((function<void()> *)&local_280,&local_298)
          ;
          ManualTicker::ManualTicker
                    ((ManualTicker *)local_260,&local_280,(double)options.ResolutionX);
          std::function<void_()>::~function(&local_280);
          while (iVar2 = glfwWindowShouldClose((GLFWwindow *)vidMode), iVar2 == 0) {
            ManualTicker::Tick((ManualTicker *)local_260);
            Renderer::Clear((Renderer *)((long)&manualTicker._pauseTimeoutInMs + 7));
            PictureRendererWithTransition::Render((PictureRendererWithTransition *)&window);
            glfwSwapBuffers((GLFWwindow *)vidMode);
            glfwPollEvents();
          }
          glfwTerminate();
          argv_local._4_4_ = 0;
          pictureRendererWithTransition._260_4_ = 1;
          ManualTicker::~ManualTicker((ManualTicker *)local_260);
        }
      }
      PictureRendererWithTransition::~PictureRendererWithTransition
                ((PictureRendererWithTransition *)&window);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e0);
    MesmerizeOptions::~MesmerizeOptions((MesmerizeOptions *)local_60);
    return argv_local._4_4_;
  }
  MesmerizeOptions::PrintOptions();
  exit(0);
}

Assistant:

int main(int argc, const char** argv)
{
    if (argc == 1){
        MesmerizeOptions::PrintOptions();
        exit(0);
    }

    MesmerizeOptions options;
    try {
        options = MesmerizeOptions::FromArgs(argc, argv);
    }catch(std::runtime_error e) {
        std::cout << "Unknown option: " << e.what() << "\n\n";
        MesmerizeOptions::PrintOptions();
        exit(1);
    }

    auto picturePaths = GetShuffledPicturePaths::GetShuffledPicturePaths(options.PathToPicturesFolder);
    if (picturePaths.empty()) {
        std::cout << "Folder " << options.PathToPicturesFolder << " has no pictures (.jpg or .png)\n";
        return 0;
    }

    PictureRendererWithTransition pictureRendererWithTransition(
            options.PanAnimationDuration,
            options.ZoomAnimationDuration,
            options.OpacityAnimationDuration,
            options.PanPercentage,
            options.ZoomPercentage);

    GLFWwindow *window;

    /* Initialize the library */
    if (!glfwInit())
        return -1;

    const GLFWvidmode *vidMode = glfwGetVideoMode(glfwGetPrimaryMonitor());
    int deviceWidth = vidMode->width;
    int deviceHeight = vidMode->height;

    if (options.IsFullScreen) {
        if (options.IsResolutionSetToMax) {
            window = glfwCreateWindow(deviceWidth, deviceHeight, "Mesmerize", glfwGetPrimaryMonitor(), NULL);
        } else {
            window = glfwCreateWindow(options.ResolutionX, options.ResolutionY, "Mesmerize", glfwGetPrimaryMonitor(),NULL);
        }
    }else {
        if (options.IsResolutionSetToMax) {
            window = glfwCreateWindow(deviceWidth, deviceHeight, "Mesmerize", NULL, NULL);
        } else {
            window = glfwCreateWindow(options.ResolutionX, options.ResolutionY, "Mesmerize", NULL, NULL);
        }
    }

    if (!window)
    {
        glfwTerminate();
        return -1;
    }
    /* Make the window's context current */
    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, [](GLFWwindow* window, int key, int scancode, int action, int mods) {
        if (key == GLFW_KEY_ESCAPE){
#ifdef ENABLE_IMGUI
            GL_CALL(ImGui_ImplGlfw_Shutdown());
            GL_CALL(ImGui_ImplOpenGL3_Shutdown());
            GL_CALL(ImGui::DestroyContext());
#endif
            glfwTerminate();
            exit(0);
        }
    });

    DeviceInformation::init(window, deviceWidth, deviceHeight);

#ifdef ENABLE_IMGUI
    GL_CALL(ImGui::CreateContext());
    GL_CALL(ImGui_ImplGlfw_InitForOpenGL(window, true));
    GL_CALL(ImGui_ImplOpenGL3_Init("#version 300 es"));
#endif

    GLenum err = glewInit();

    if (GLEW_OK != err)
    {
        /* Problem: glewInit failed, something is seriously wrong. */
        fprintf(stderr, "Error: %s\n", glewGetErrorString(err));
    }

#if ENABLE_GL_DEBUG_OUTPUT
    fprintf(stdout, "Status: Using GLEW %s\n", glewGetString(GLEW_VERSION));
    // During init, enable debug output
    GL_CALL(glEnable(GL_DEBUG_OUTPUT));
    GL_CALL(glDebugMessageCallback(MessageCallback, 0));
#endif

    GL_CALL(glEnable(GL_BLEND));
    GL_CALL(glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA));
    GL_CALL(glBlendEquation(GL_FUNC_ADD));


    Picture::InitShaders();

    glfwSwapInterval(1);

    Renderer renderer;
    /* Loop until the user closes the window */
    static int counter = 0;
    ManualTicker manualTicker([&] {
        int index = ++counter % picturePaths.size();
        manualTicker.Pause(15000); //some pictures take a considerable amount of time to load in the pi, more than 15 secs probably there was an error and the event is not coming
        pictureRendererWithTransition.Load(picturePaths[index], [&manualTicker]() {
            manualTicker.Resume();
        });
    }, options.DisplayPictureDuration);

    while (!glfwWindowShouldClose(window))
    {
        manualTicker.Tick(); //will trigger the change of picture if enough time has passed
        /* Render here */
        renderer.Clear();

#ifdef ENABLE_IMGUI
        GL_CALL(ImGui_ImplOpenGL3_NewFrame());
        GL_CALL(ImGui_ImplGlfw_NewFrame());
        GL_CALL(ImGui::NewFrame());
        {
            GL_CALL(ImGui::Begin("Debug"));

            if (ImGui::Button("<"))
            { // Buttons return true when clicked (most widgets return true when edited/activated)
                int index = --counter % picturePaths.size();
                pictureRendererWithTransition.Load(picturePaths[index]);
            }

            ImGui::SameLine();
            if (ImGui::Button(">"))
            { // Buttons return true when clicked (most widgets return true when edited/activated)
                int index = ++counter % picturePaths.size();
                pictureRendererWithTransition.Load(picturePaths[index]);
            }
            ImGui::SameLine();
            ImGui::Text("counter = %d", counter);

            ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
            ImGui::End();
        }
#endif

        pictureRendererWithTransition.Render();

#ifdef ENABLE_IMGUI
        GL_CALL(ImGui::Render());
        GL_CALL(ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData()));
#endif
        /* Swap front and back buffers */
        glfwSwapBuffers(window);

        /* Poll for and process events */
        glfwPollEvents();
    }

#ifdef ENABLE_IMGUI
    GL_CALL(ImGui_ImplGlfw_Shutdown());
    GL_CALL(ImGui_ImplOpenGL3_Shutdown());
    GL_CALL(ImGui::DestroyContext());
#endif
    glfwTerminate();
    return 0;
}